

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::ScanLineInputFile::rawPixelDataToBuffer
          (ScanLineInputFile *this,int scanLine,char *pixelData,int *pixelDataSize)

{
  exr_result_t eVar1;
  exr_storage_t eVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined8 uVar5;
  stringstream *text;
  int *in_RCX;
  stringstream _iex_throw_s_3;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  exr_chunk_info_t cinfo;
  stringstream *in_stack_fffffffffffff8b8;
  ArgExc *in_stack_fffffffffffff8c0;
  void *in_stack_fffffffffffff8e0;
  exr_chunk_info_t *in_stack_fffffffffffff8e8;
  undefined8 in_stack_fffffffffffff8f0;
  int part_index;
  exr_const_context_t in_stack_fffffffffffff8f8;
  exr_chunk_info_t *in_stack_fffffffffffff938;
  undefined8 in_stack_fffffffffffff940;
  exr_const_context_t in_stack_fffffffffffff948;
  stringstream local_690 [16];
  ostream local_680 [268];
  int in_stack_fffffffffffffa8c;
  Context *in_stack_fffffffffffffa90;
  stringstream local_508 [16];
  ostream local_4f8 [376];
  stringstream local_380 [16];
  ostream local_370 [392];
  stringstream local_1e8 [16];
  ostream local_1d8 [408];
  ulong local_40;
  int *local_20;
  
  part_index = (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20);
  local_20 = in_RCX;
  Context::operator_cast_to__priv_exr_context_t_((Context *)0x1954bb);
  std::
  __shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1954d4);
  eVar1 = exr_read_scanline_chunk_info
                    (in_stack_fffffffffffff948,(int)((ulong)in_stack_fffffffffffff940 >> 0x20),
                     (int)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  if (eVar1 != 0) {
    std::
    __shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1957fb);
    eVar2 = Context::storage(in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
    if (eVar2 == EXR_STORAGE_TILED) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_508);
      poVar3 = std::operator<<(local_4f8,"Error reading pixel data from image file \"");
      pcVar4 = fileName((ScanLineInputFile *)0x195850);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::operator<<(poVar3,"\". Tried to read a raw scanline from a tiled image.");
      uVar5 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
      __cxa_throw(uVar5,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_690);
    poVar3 = std::operator<<(local_680,"Error reading pixel data from image file \"");
    pcVar4 = fileName((ScanLineInputFile *)0x195943);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\". Unable to query data block information.");
    text = (stringstream *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)poVar3,text);
    __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if ((ulong)(long)*local_20 < local_40) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1e8);
    poVar3 = std::operator<<(local_1d8,"Error reading pixel data from image file \"");
    pcVar4 = fileName((ScanLineInputFile *)0x19555a);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\". Provided buffer is too small to read raw pixel data:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*local_20);
    std::operator<<(poVar3," bytes.");
    uVar5 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
    __cxa_throw(uVar5,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  *local_20 = (int)local_40;
  Context::operator_cast_to__priv_exr_context_t_((Context *)0x195680);
  std::
  __shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x195696);
  eVar1 = exr_read_chunk(in_stack_fffffffffffff8f8,part_index,in_stack_fffffffffffff8e8,
                         in_stack_fffffffffffff8e0);
  if (eVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_380);
    poVar3 = std::operator<<(local_370,"Error reading pixel data from image file \"");
    pcVar4 = fileName((ScanLineInputFile *)0x1956fb);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\". Unable to read raw pixel data of ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*local_20);
    std::operator<<(poVar3," bytes.");
    uVar5 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
    __cxa_throw(uVar5,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  return;
}

Assistant:

void
ScanLineInputFile::rawPixelDataToBuffer (
    int scanLine, char* pixelData, int& pixelDataSize) const
{
    exr_chunk_info_t cinfo;
    if (EXR_ERR_SUCCESS == exr_read_scanline_chunk_info (
                               _ctxt, _data->partNumber, scanLine, &cinfo))
    {
        if (cinfo.packed_size > static_cast<uint64_t> (pixelDataSize))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName ()
                    << "\". Provided buffer is too small to read raw pixel data:"
                    << pixelDataSize << " bytes.");
        }

        pixelDataSize = static_cast<int> (cinfo.packed_size);

        if (EXR_ERR_SUCCESS !=
            exr_read_chunk (_ctxt, _data->partNumber, &cinfo, pixelData))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName () << "\". Unable to read raw pixel data of "
                    << pixelDataSize << " bytes.");
        }
    }
    else
    {
        if (_ctxt.storage (_data->partNumber) == EXR_STORAGE_TILED)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName ()
                    << "\". Tried to read a raw scanline from a tiled image.");
        }
        else
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName ()
                    << "\". Unable to query data block information.");
        }
    }
}